

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::coap::Message::SetUriPath
          (Error *__return_storage_ptr__,Message *this,string *aUriPath)

{
  ErrorCode EVar1;
  pointer pcVar2;
  string NormalizedUriPath;
  allocator_type local_91;
  string local_90;
  OptionValue local_70;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar2 = (aUriPath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + aUriPath->_M_string_length);
  NormalizeUriPath((Error *)local_58,&local_90);
  __return_storage_ptr__->mCode = local_58._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_50);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if (EVar1 == kNone) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_70,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_90._M_dataplus._M_p,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_90._M_dataplus._M_p + local_90._M_string_length),&local_91);
    AppendOption((Error *)local_58,this,kUriPath,&local_70);
    __return_storage_ptr__->mCode = local_58._0_4_;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_50)
    ;
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
    if (local_70.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::SetUriPath(const std::string &aUriPath)
{
    Error       error;
    std::string NormalizedUriPath = aUriPath;

    SuccessOrExit(error = NormalizeUriPath(NormalizedUriPath));
    SuccessOrExit(error = AppendOption(OptionType::kUriPath, OptionValue{NormalizedUriPath}));

exit:
    return error;
}